

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O0

vector<char_data_*,_std::allocator<char_data_*>_> * __thiscall
CQueue::GetCharacterData<char_data*&,char_const(&)[5]>
          (CQueue *this,tuple<char_data_*&,_const_char_(&)[5]> *t)

{
  vector<char_data_*,_std::allocator<char_data_*>_> *in_RDI;
  vector<char_data_*,_std::allocator<char_data_*>_> *accumulator;
  vector<char_data_*,_std::allocator<char_data_*>_> *__f;
  
  __f = in_RDI;
  std::vector<char_data_*,_std::allocator<char_data_*>_>::vector
            ((vector<char_data_*,_std::allocator<char_data_*>_> *)0x677a09);
  std::
  apply<CQueue::GetCharacterData<char_data*&,char_const(&)[5]>(std::tuple<char_data*&,char_const(&)[5]>&)::_lambda((auto:1_const&)___)_1_,std::tuple<char_data*&,char_const(&)[5]>&>
            ((anon_class_8_1_18cdd2e6 *)__f,(tuple<char_data_*&,_const_char_(&)[5]> *)in_RDI);
  return in_RDI;
}

Assistant:

std::vector<CHAR_DATA*> GetCharacterData(std::tuple<Tp...>& t)
	{
		std::vector<CHAR_DATA*> accumulator;

		std::apply([&] (const auto&... tupleArgs) 
		{
			auto processTuple = [&](const auto& x)
			{
				// decay x to get the actual argument type to compare to our character data type 
		 		if constexpr (std::is_same<typename std::decay<decltype(x)>::type,CHAR_DATA*>::value)
					accumulator.push_back(x);
			};
			(processTuple(tupleArgs), ...);  // fold expression - calls processTuple for each argument in tupleArgs
		}, t);

		return accumulator;
	}